

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O3

Node<label::JSONLabel> * __thiscall
parser::BracketNotationParser<label::JSONLabel>::parse_single
          (Node<label::JSONLabel> *__return_storage_ptr__,
          BracketNotationParser<label::JSONLabel> *this,string *tree_string)

{
  pointer *pprVar1;
  pointer pcVar2;
  Node<label::JSONLabel> *pNVar3;
  size_type sVar4;
  int iVar5;
  long lVar6;
  pointer pbVar7;
  char *__n;
  pointer pbVar8;
  string match_str;
  Node<label::JSONLabel> *root;
  JSONLabel node_label;
  Node<label::JSONLabel> n;
  JSONLabel root_label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_150;
  Node<label::JSONLabel> *local_130;
  pointer local_128;
  reference_wrapper<node::Node<label::JSONLabel>_> local_120;
  undefined1 local_118 [24];
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  uint local_e0;
  JSONLabel local_d8;
  Node<label::JSONLabel> local_b0;
  JSONLabel local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_130 = __return_storage_ptr__;
  get_tokens(&local_48,this,tree_string);
  local_128 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar2 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,
             pcVar2 + local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
  sVar4 = local_150._M_string_length;
  if ((((char *)local_150._M_string_length == (char *)(this->kLeftBracket)._M_string_length) &&
      (((char *)local_150._M_string_length == (char *)0x0 ||
       (iVar5 = bcmp(local_150._M_dataplus._M_p,(this->kLeftBracket)._M_dataplus._M_p,
                     local_150._M_string_length), iVar5 == 0)))) ||
     (((char *)sVar4 == (char *)(this->kRightBracket)._M_string_length &&
      (((char *)sVar4 == (char *)0x0 ||
       (iVar5 = bcmp(local_150._M_dataplus._M_p,(this->kRightBracket)._M_dataplus._M_p,sVar4),
       iVar5 == 0)))))) {
    std::__cxx11::string::_M_replace((ulong)&local_150,0,(char *)sVar4,0x1090c2);
    pbVar7 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  else {
    pbVar7 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
  }
  label::JSONLabel::JSONLabel(&local_70,&local_150);
  pNVar3 = local_130;
  node::Node<label::JSONLabel>::Node(local_130,&local_70);
  local_b0.children_.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pNVar3;
  std::
  vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
  ::emplace_back<std::reference_wrapper<node::Node<label::JSONLabel>>>
            ((vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
              *)this,(reference_wrapper<node::Node<label::JSONLabel>_> *)&local_b0);
  if (pbVar7 != local_128) {
    do {
      std::__cxx11::string::_M_assign((string *)&local_150);
      __n = (char *)local_150._M_string_length;
      lVar6 = 0x20;
      if (((char *)local_150._M_string_length == (char *)(this->kLeftBracket)._M_string_length) &&
         (((char *)local_150._M_string_length == (char *)0x0 ||
          (iVar5 = bcmp(local_150._M_dataplus._M_p,(this->kLeftBracket)._M_dataplus._M_p,
                        local_150._M_string_length), iVar5 == 0)))) {
        pbVar8 = pbVar7 + 1;
        std::__cxx11::string::_M_assign((string *)&local_150);
        sVar4 = local_150._M_string_length;
        if ((((char *)local_150._M_string_length == (char *)(this->kLeftBracket)._M_string_length)
            && (((char *)local_150._M_string_length == (char *)0x0 ||
                (iVar5 = bcmp(local_150._M_dataplus._M_p,(this->kLeftBracket)._M_dataplus._M_p,
                              local_150._M_string_length), iVar5 == 0)))) ||
           (((char *)sVar4 == (char *)(this->kRightBracket)._M_string_length &&
            (((char *)sVar4 == (char *)0x0 ||
             (iVar5 = bcmp(local_150._M_dataplus._M_p,(this->kRightBracket)._M_dataplus._M_p,sVar4),
             iVar5 == 0)))))) {
          std::__cxx11::string::_M_replace((ulong)&local_150,0,(char *)sVar4,0x1090c2);
        }
        else {
          pbVar8 = pbVar7 + 2;
        }
        label::JSONLabel::JSONLabel(&local_d8,&local_150);
        node::Node<label::JSONLabel>::Node(&local_b0,&local_d8);
        pNVar3 = (this->node_stack).
                 super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
        std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
        vector((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                *)local_118,&local_b0.children_);
        local_100._M_p = (pointer)&local_f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_b0.label_.label_._M_dataplus._M_p,
                   local_b0.label_.label_._M_dataplus._M_p + local_b0.label_.label_._M_string_length
                  );
        local_e0 = local_b0.label_.type_;
        std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
        push_back(&pNVar3->children_,(value_type *)local_118);
        local_120._M_data =
             (pNVar3->children_).
             super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::
        vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
        ::emplace_back<std::reference_wrapper<node::Node<label::JSONLabel>>>
                  ((vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
                    *)this,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_p != &local_f0) {
          operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
        }
        std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
        ~vector((vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
                 *)local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.label_.label_._M_dataplus._M_p != &local_b0.label_.label_.field_2) {
          operator_delete(local_b0.label_.label_._M_dataplus._M_p,
                          local_b0.label_.label_.field_2._M_allocated_capacity + 1);
        }
        std::vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>::
        ~vector(&local_b0.children_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.label_._M_dataplus._M_p != &local_d8.label_.field_2) {
          operator_delete(local_d8.label_._M_dataplus._M_p,
                          local_d8.label_.field_2._M_allocated_capacity + 1);
        }
        lVar6 = 0;
        __n = (char *)local_150._M_string_length;
        pbVar7 = pbVar8;
      }
      if ((__n == (char *)(this->kRightBracket)._M_string_length) &&
         ((__n == (char *)0x0 ||
          (iVar5 = bcmp(local_150._M_dataplus._M_p,(this->kRightBracket)._M_dataplus._M_p,
                        (size_t)__n), iVar5 == 0)))) {
        pprVar1 = &(this->node_stack).
                   super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + -1;
        lVar6 = 0x20;
      }
      pbVar7 = (pointer)((long)&(pbVar7->_M_dataplus)._M_p + lVar6);
    } while (pbVar7 != local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label_._M_dataplus._M_p != &local_70.label_.field_2) {
    operator_delete(local_70.label_._M_dataplus._M_p,
                    local_70.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_130;
}

Assistant:

node::Node<Label> BracketNotationParser<Label>::parse_single(
    const std::string& tree_string) {

  std::vector<std::string> tokens = get_tokens(tree_string);

  // Tokenize the input string - get iterator over tokens.
  auto tokens_begin = tokens.begin();
  auto tokens_end = tokens.end();

  // Deal with the root node separately.
  ++tokens_begin; // Advance tokens to label.
  std::string match_str = *tokens_begin;
  if (match_str == kLeftBracket || match_str == kRightBracket) { // Root has an empty label.
    match_str = "";
    // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
  } else { // Non-empty label.
    ++tokens_begin; // Advance tokens.
  }
  Label root_label(match_str);
  node::Node<Label> root(root_label);
  node_stack.push_back(std::ref(root));

  bool consumed_token = false;

  // Iterate all remaining tokens.
  while (tokens_begin != tokens_end) {
    match_str = *tokens_begin;
    consumed_token = false;

    if (match_str == kLeftBracket) { // Enter node.
      consumed_token = true;
      ++tokens_begin; // Advance tokens to label.
      match_str = *tokens_begin;

      if (match_str == kLeftBracket || match_str == kRightBracket) { // Node has an empty label.
        match_str = "";
        // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
      } else { // Non-empty label.
        ++tokens_begin; // Advance tokens.
      }

      // Create new node.
      Label node_label(match_str);
      node::Node<Label> n(node_label);

      // Move n to become a child.
      // Return reference from add_child to the 'new-located' object.
      // Put a reference to just-moved n (last child of its parent) on a stack.
      node_stack.push_back(std::ref(node_stack.back().get().add_child(n)));
    }

    if (match_str == kRightBracket) { // Exit node.
      consumed_token = true;
      node_stack.pop_back();
      ++tokens_begin; // Advance tokens.
    }

    // Skip incorrect token.
    if (consumed_token == false) {
      ++tokens_begin; // Advance tokens.
    }
  }
  return root;
}